

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-perf.cpp
# Opt level: O0

int64_t cpu_cycles(void)

{
  ulong uVar1;
  undefined8 in_RAX;
  
  uVar1 = rdtsc();
  return CONCAT44((int)((ulong)in_RAX >> 0x20),(int)uVar1) | uVar1 & 0xffffffff00000000;
}

Assistant:

inline int64_t cpu_cycles() {
// Rough way to detect new-ish CPUs
#ifdef __POPCNT__
    unsigned int dummy;
    return __rdtscp(&dummy);
#else
    return __rdtsc();
#endif
}